

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece src_str,char *idst,char replace_char)

{
  StringPiece str;
  StringPiece str_00;
  stringpiece_ssize_type sVar1;
  char in_CL;
  char *in_RDX;
  stringpiece_ssize_type in_RSI;
  char *in_RDI;
  StringPiece str2;
  char *dst;
  char *srclimit;
  char *src;
  int n;
  int len;
  char *isrc;
  char *in_stack_ffffffffffffff80;
  stringpiece_ssize_type in_stack_ffffffffffffff88;
  StringPiece local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  stringpiece_ssize_type local_40;
  int local_38;
  int local_34;
  char *local_30;
  char local_21;
  char *local_20;
  StringPiece local_18;
  char *local_8;
  
  local_21 = in_CL;
  local_20 = in_RDX;
  local_18.ptr_ = in_RDI;
  local_18.length_ = in_RSI;
  local_30 = StringPiece::data(&local_18);
  sVar1 = StringPiece::length(&local_18);
  local_34 = (int)sVar1;
  local_48 = local_18.ptr_;
  local_40 = local_18.length_;
  str.length_ = in_stack_ffffffffffffff88;
  str.ptr_ = in_stack_ffffffffffffff80;
  local_38 = UTF8SpnStructurallyValid(str);
  if (local_38 == local_34) {
    local_8 = local_30;
  }
  else {
    local_50 = local_30;
    local_58 = local_30 + local_34;
    local_60 = local_20;
    memmove(local_20,local_30,(long)local_38);
    local_60 = local_60 + local_38;
    for (local_50 = local_50 + local_38; local_50 < local_58; local_50 = local_50 + local_38) {
      *local_60 = local_21;
      local_50 = local_50 + 1;
      local_60 = local_60 + 1;
      StringPiece::StringPiece(&local_70,local_50,(long)local_58 - (long)local_50);
      str_00.length_ = local_70.length_;
      str_00.ptr_ = local_70.ptr_;
      local_38 = UTF8SpnStructurallyValid(str_00);
      memmove(local_60,local_50,(long)local_38);
      local_60 = local_60 + local_38;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}